

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O1

void __thiscall
Eigen::
CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
::~CwiseBinaryOp(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseSparseProduct<const_Eigen::SparseMatrix<double,_0,_int>_&,_const_Eigen::SparseMatrix<double,_0,_int>_&>_>
                 *this)

{
  free((this->m_rhs).m_outerIndex);
  free((this->m_rhs).m_innerNonZeros);
  internal::CompressedStorage<double,_int>::~CompressedStorage(&(this->m_rhs).m_data);
  return;
}

Assistant:

class CwiseBinaryOp : internal::no_assignment_operator,
  public CwiseBinaryOpImpl<
          BinaryOp, Lhs, Rhs,
          typename internal::promote_storage_type<typename internal::traits<Lhs>::StorageKind,
                                           typename internal::traits<Rhs>::StorageKind>::ret>
{
  public:

    typedef typename CwiseBinaryOpImpl<
        BinaryOp, Lhs, Rhs,
        typename internal::promote_storage_type<typename internal::traits<Lhs>::StorageKind,
                                         typename internal::traits<Rhs>::StorageKind>::ret>::Base Base;
    EIGEN_GENERIC_PUBLIC_INTERFACE(CwiseBinaryOp)

    typedef typename internal::nested<Lhs>::type LhsNested;
    typedef typename internal::nested<Rhs>::type RhsNested;
    typedef typename internal::remove_reference<LhsNested>::type _LhsNested;
    typedef typename internal::remove_reference<RhsNested>::type _RhsNested;

    EIGEN_STRONG_INLINE CwiseBinaryOp(const Lhs& aLhs, const Rhs& aRhs, const BinaryOp& func = BinaryOp())
      : m_lhs(aLhs), m_rhs(aRhs), m_functor(func)
    {
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename Rhs::Scalar);
      // require the sizes to match
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs, Rhs)
      eigen_assert(aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols());
    }

    EIGEN_STRONG_INLINE Index rows() const {
      // return the fixed size type if available to enable compile time optimizations
      if (internal::traits<typename internal::remove_all<LhsNested>::type>::RowsAtCompileTime==Dynamic)
        return m_rhs.rows();
      else
        return m_lhs.rows();
    }